

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

WW<68UL> * __thiscall GF2::WW<68UL>::Reverse(WW<68UL> *this)

{
  ulong uVar1;
  ulong pos;
  ulong pos_00;
  
  pos = 0;
  for (pos_00 = 0x43; pos + 1 < pos_00 + 1; pos_00 = pos_00 - 1) {
    uVar1 = this->_words[pos >> 6];
    Set(this,pos,(this->_words[pos_00 >> 6] >> (pos_00 & 0x3f) & 1) != 0);
    Set(this,pos_00,(uVar1 >> (pos & 0x3f) & 1) != 0);
    pos = pos + 1;
  }
  return this;
}

Assistant:

WW& Reverse()
	{	
		for (size_t start = 0, end = _n; start + 1 < end; ++start, --end)
		{
			bool save = Test(start);
			Set(start, Test(end - 1));
			Set(end - 1, save);
		}
		return *this;
	}